

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sections.cpp
# Opt level: O0

void ast::Sections::listing(ostream *lst_file)

{
  uint uVar1;
  uint uVar2;
  size_type sVar3;
  undefined8 uVar4;
  reference ppSVar5;
  ulong local_18;
  size_t i;
  ostream *lst_file_local;
  
  std::operator<<(lst_file,"Sections\n");
  ostream_printf(lst_file,"%-8s%-16s%-10s%s\n","Index","Name","Address","Size");
  local_18 = 0;
  while( true ) {
    sVar3 = std::vector<ast::Section_*,_std::allocator<ast::Section_*>_>::size
                      ((vector<ast::Section_*,_std::allocator<ast::Section_*>_> *)table);
    if (sVar3 <= local_18) break;
    std::vector<ast::Section_*,_std::allocator<ast::Section_*>_>::operator[]
              ((vector<ast::Section_*,_std::allocator<ast::Section_*>_> *)table,local_18);
    uVar4 = std::__cxx11::string::c_str();
    ppSVar5 = std::vector<ast::Section_*,_std::allocator<ast::Section_*>_>::operator[]
                        ((vector<ast::Section_*,_std::allocator<ast::Section_*>_> *)table,local_18);
    uVar1 = (*ppSVar5)->base_address;
    ppSVar5 = std::vector<ast::Section_*,_std::allocator<ast::Section_*>_>::operator[]
                        ((vector<ast::Section_*,_std::allocator<ast::Section_*>_> *)table,local_18);
    uVar2 = (*ppSVar5)->content_size;
    ppSVar5 = std::vector<ast::Section_*,_std::allocator<ast::Section_*>_>::operator[]
                        ((vector<ast::Section_*,_std::allocator<ast::Section_*>_> *)table,local_18);
    ostream_printf(lst_file,"%-8d%-16s%04X      %04X %d\n",local_18,uVar4,(ulong)uVar1,(ulong)uVar2,
                   (*ppSVar5)->content_size);
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

void Sections::listing(std::ostream& lst_file)
{
	lst_file << "Sections\n";
	ostream_printf(lst_file, "%-8s%-16s%-10s%s\n", "Index", "Name", "Address", "Size");
	for (size_t i = 0; i < table.size(); ++i) {
		ostream_printf(lst_file, "%-8d%-16s%04X      %04X %d\n", i,
				table[i]->name.c_str(), table[i]->base_address,
				table[i]->content_size, table[i]->content_size);
	}
}